

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool LookupHelper<std::map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>,CKeyID,std::pair<CPubKey,KeyOriginInfo>>
               (map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                *map,CKeyID *key,pair<CPubKey,_KeyOriginInfo> *value)

{
  long lVar1;
  bool bVar2;
  pair<CPubKey,_KeyOriginInfo> *in_RDX;
  long in_FS_OFFSET;
  const_iterator it;
  key_type *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::find((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8)
  ;
  std::
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = std::operator==((_Self *)in_RDX,
                          (_Self *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                *)in_stack_ffffffffffffffb8);
    std::pair<CPubKey,_KeyOriginInfo>::operator=
              (in_RDX,(type)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool LookupHelper(const M& map, const K& key, V& value)
{
    auto it = map.find(key);
    if (it != map.end()) {
        value = it->second;
        return true;
    }
    return false;
}